

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  u32 uVar2;
  Wal *pWal;
  u32 *puVar3;
  Pager *pPVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  u32 uVar9;
  u32 iPage;
  u32 nTruncate_00;
  u8 *p;
  PgHdr **ppPVar10;
  long lVar11;
  sqlite3_int64 sVar12;
  Pgno nTruncate_01;
  PgHdr *pPVar13;
  long lVar14;
  long lVar15;
  PgHdr *pPVar16;
  long lVar17;
  int iVar18;
  long in_FS_OFFSET;
  ulong local_d0;
  PgHdr *local_c8;
  long local_b0;
  PgHdr *pList_local;
  sqlite3_file *local_a0;
  u8 *local_98;
  u8 *local_90;
  Pager *local_88;
  WalWriter w;
  u32 aCksum [2];
  u32 salt1;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  uint local_4c;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pList_local = pList;
  if (isCommit == 0) {
    iVar5 = 1;
  }
  else {
    ppPVar10 = &pList_local;
    iVar5 = 0;
    for (; *ppPVar10 = pList, pList != (PgHdr *)0x0; pList = pList->pDirty) {
      if (pList->pgno <= nTruncate) {
        ppPVar10 = &pList->pDirty;
      }
      iVar5 = iVar5 + (uint)(pList->pgno <= nTruncate);
    }
  }
  pPVar13 = pList_local;
  pPager->aStat[2] = pPager->aStat[2] + iVar5;
  if (pList_local->pgno == 1) {
    pager_write_changecounter(pList_local);
  }
  pWal = pPager->pWal;
  uVar2 = pPager->pageSize;
  bVar1 = pPager->walSyncFlags;
  uVar6 = (uint)bVar1;
  puVar3 = *pWal->apWiData;
  iVar5 = bcmp(&pWal->hdr,puVar3,0x30);
  if (iVar5 == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = puVar3[4] + 1;
  }
  local_88 = pPager;
  if (pWal->readLock == 0) {
    if (puVar3[0x18] == 0) {
LAB_002210c6:
      walUnlockShared(pWal,3);
      pWal->readLock = -1;
      iVar18 = 1;
      do {
        iVar5 = walTryBeginRead(pWal,(int *)&salt1,1,iVar18);
        iVar18 = iVar18 + 1;
      } while (iVar5 == -1);
    }
    else {
      sqlite3_randomness(4,&salt1);
      iVar5 = walLockExclusive(pWal,4,4);
      if (iVar5 == 5) goto LAB_002210c6;
      if (iVar5 == 0) {
        walRestartHdr(pWal,salt1);
        walUnlockExclusive(pWal,4,4);
        goto LAB_002210c6;
      }
    }
    if (iVar5 != 0) goto LAB_002211f0;
  }
  local_d0 = (ulong)(pWal->hdr).mxFrame;
  if (local_d0 == 0) {
    _salt1 = 0x18e22d0082067f37;
    local_50 = (undefined1)(uVar2 >> 0x18);
    local_4f = (undefined1)(uVar2 >> 0x10);
    local_4e = (undefined1)(uVar2 >> 8);
    local_4d = (undefined1)uVar2;
    uVar8 = pWal->nCkpt;
    local_4c = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    if (uVar8 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_48 = *(undefined8 *)(pWal->hdr).aSalt;
    walChecksumBytes(1,(u8 *)&salt1,0x18,(u32 *)0x0,aCksum);
    local_40 = aCksum[0] >> 0x18 | (aCksum[0] & 0xff0000) >> 8 | (aCksum[0] & 0xff00) << 8 |
               aCksum[0] << 0x18;
    local_3c = aCksum[1] >> 0x18 | (aCksum[1] & 0xff0000) >> 8 | (aCksum[1] & 0xff00) << 8 |
               aCksum[1] << 0x18;
    pWal->szPage = uVar2;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = aCksum[0];
    (pWal->hdr).aFrameCksum[1] = aCksum[1];
    pWal->truncateOnCommit = '\x01';
    iVar5 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&salt1,0x20,0);
    if ((iVar5 != 0) ||
       (((uVar6 != 0 && (pWal->syncHeader != '\0')) &&
        (iVar5 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar6 & 0x13), iVar5 != 0))))
    goto LAB_002211f0;
  }
  local_a0 = pWal->pWalFd;
  w.iSyncPoint = 0;
  lVar11 = (long)(int)uVar2 + 0x18;
  lVar15 = local_d0 * lVar11 + 0x20;
  local_c8 = (PgHdr *)0x0;
  w.pWal = pWal;
  w.pFd = local_a0;
  w.syncFlags = uVar6;
  w.szPage = uVar2;
  for (pPVar16 = pPVar13; uVar8 = (uint)local_d0, pPVar16 != (PgHdr *)0x0; pPVar16 = pPVar16->pDirty
      ) {
    if (uVar7 == 0) {
LAB_00220fe6:
      if (isCommit == 0) {
        nTruncate_01 = 0;
      }
      else {
        nTruncate_01 = 0;
        if (pPVar16->pDirty == (PgHdr *)0x0) {
          nTruncate_01 = nTruncate;
        }
      }
LAB_00220fff:
      iVar5 = walWriteOneFrame(&w,pPVar16,nTruncate_01,lVar15);
      if (iVar5 != 0) goto LAB_002211f0;
      local_d0 = (ulong)(uVar8 + 1);
      lVar15 = lVar15 + lVar11;
      *(byte *)&pPVar16->flags = (byte)pPVar16->flags | 0x40;
      local_c8 = pPVar16;
    }
    else {
      if ((isCommit != 0) && (nTruncate_01 = nTruncate, pPVar16->pDirty == (PgHdr *)0x0))
      goto LAB_00220fff;
      _salt1 = _salt1 & 0xffffffff00000000;
      sqlite3WalFindFrame(pWal,pPVar16->pgno,&salt1);
      if (salt1 < uVar7) goto LAB_00220fe6;
      if (salt1 <= pWal->iReCksum - 1) {
        pWal->iReCksum = salt1;
      }
      iVar5 = (*pWal->pWalFd->pMethods->xWrite)
                        (pWal->pWalFd,pPVar16->pData,uVar2,(ulong)(salt1 - 1) * lVar11 + 0x38);
      if (iVar5 != 0) goto LAB_002211f0;
      *(byte *)&pPVar16->flags = (byte)pPVar16->flags & 0xbf;
    }
  }
  if (isCommit == 0) {
    iVar5 = 0;
    iVar18 = 0;
  }
  else {
    if (pWal->iReCksum != 0) {
      local_b0 = (long)(int)pWal->szPage + 0x18;
      iVar18 = (int)local_b0;
      p = (u8 *)sqlite3_malloc(iVar18);
      if (p == (u8 *)0x0) {
        iVar5 = 7;
        goto LAB_002211f0;
      }
      if (pWal->iReCksum == 1) {
        sVar12 = 0x18;
      }
      else {
        local_b0 = (long)iVar18;
        sVar12 = (ulong)(pWal->iReCksum - 2) * local_b0 + 0x30;
      }
      iVar5 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,sVar12);
      uVar9 = sqlite3Get4byte(p);
      (pWal->hdr).aFrameCksum[0] = uVar9;
      local_90 = p + 4;
      uVar9 = sqlite3Get4byte(local_90);
      (pWal->hdr).aFrameCksum[1] = uVar9;
      uVar9 = pWal->iReCksum;
      pWal->iReCksum = 0;
      local_98 = p + 0x18;
      for (; (iVar5 == 0 && (uVar9 <= uVar8)); uVar9 = uVar9 + 1) {
        lVar17 = (ulong)(uVar9 - 1) * local_b0 + 0x20;
        iVar5 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar18,lVar17);
        if (iVar5 == 0) {
          iPage = sqlite3Get4byte(p);
          nTruncate_00 = sqlite3Get4byte(local_90);
          walEncodeFrame(pWal,iPage,nTruncate_00,local_98,(u8 *)&salt1);
          iVar5 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&salt1,0x18,lVar17);
        }
      }
      sqlite3_free(p);
      if (iVar5 != 0) goto LAB_002211f0;
    }
    if ((bVar1 & 0x20) == 0) {
      iVar18 = 0;
LAB_002213b9:
      iVar5 = 0;
    }
    else {
      if (pWal->padToSectorBoundary == '\0') {
        iVar18 = 0;
      }
      else {
        uVar7 = sqlite3SectorSize(pWal->pWalFd);
        lVar14 = (ulong)uVar7 + lVar15 + -1;
        lVar14 = lVar14 - lVar14 % (long)(ulong)uVar7;
        iVar18 = 0;
        w.iSyncPoint = lVar14;
        for (lVar17 = lVar15; lVar17 < lVar14; lVar17 = lVar17 + lVar11) {
          iVar5 = walWriteOneFrame(&w,local_c8,nTruncate,lVar17);
          if (iVar5 != 0) goto LAB_002211f0;
          iVar18 = iVar18 + 1;
        }
        if (lVar14 != lVar15) goto LAB_002213b9;
      }
      iVar5 = (*local_a0->pMethods->xSync)(local_a0,uVar6 & 0x13);
    }
    if ((pWal->truncateOnCommit != '\0') && (lVar15 = pWal->mxWalSize, -1 < lVar15)) {
      lVar11 = (ulong)(uVar8 + iVar18) * lVar11 + 0x20;
      if (lVar11 <= lVar15) {
        lVar11 = lVar15;
      }
      walLimitSize(pWal,lVar11);
      pWal->truncateOnCommit = '\0';
    }
  }
  uVar9 = (pWal->hdr).mxFrame;
  pPVar16 = pPVar13;
  while ((pPVar16 != (PgHdr *)0x0 && (iVar5 == 0))) {
    iVar5 = 0;
    if ((pPVar16->flags & 0x40) != 0) {
      uVar9 = uVar9 + 1;
      iVar5 = walIndexAppend(pWal,uVar9,pPVar16->pgno);
    }
    pPVar16 = pPVar16->pDirty;
  }
  for (; (iVar5 == 0 && (0 < iVar18)); iVar18 = iVar18 + -1) {
    uVar9 = uVar9 + 1;
    iVar5 = walIndexAppend(pWal,uVar9,local_c8->pgno);
  }
  if (iVar5 == 0) {
    (pWal->hdr).szPage = (ushort)(uVar2 >> 0x10) | (ushort)uVar2 & 0xff00;
    (pWal->hdr).mxFrame = uVar9;
    if (isCommit != 0) {
      puVar3 = &(pWal->hdr).iChange;
      *puVar3 = *puVar3 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = uVar9;
    }
    pPVar4 = local_88;
    iVar5 = 0;
    if (local_88->pBackup != (sqlite3_backup *)0x0) {
      for (; pPVar13 != (PgHdr *)0x0; pPVar13 = pPVar13->pDirty) {
        sqlite3BackupUpdate(pPVar4->pBackup,pPVar13->pgno,(u8 *)pPVar13->pData);
      }
    }
  }
LAB_002211f0:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal, 
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}